

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O2

ion_status_t bpptree_update(ion_dictionary_t *dictionary,ion_key_t key,ion_value_t value)

{
  ion_dictionary_parent_t *piVar1;
  ion_bpp_err_t iVar2;
  ion_status_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ion_result_count_t count;
  ion_file_offset_t offset;
  uint local_2c;
  ion_file_offset_t local_28;
  
  local_2c = 0;
  piVar1 = dictionary->instance;
  iVar2 = b_get(*(ion_bpp_handle_t *)(piVar1 + 1),key,&local_28);
  if (iVar2 == bErrKeyNotFound) {
    iVar3 = bpptree_insert(dictionary,key,value);
    uVar5 = (ulong)iVar3 & 0xff;
    uVar4 = (ulong)iVar3 >> 0x20;
    uVar6 = (ulong)(iVar3._0_4_ & 0xffffff00);
  }
  else {
    lfb_update_all((ion_lfb_t *)&piVar1[1].record.value_size,local_28,(piVar1->record).value_size,
                   (ion_byte_t *)value,(ion_result_count_t *)&local_2c);
    uVar5 = 0;
    uVar4 = (ulong)local_2c;
    uVar6 = 0;
  }
  return (ion_status_t)(uVar4 << 0x20 | uVar6 | uVar5);
}

Assistant:

ion_status_t
bpptree_update(
	ion_dictionary_t	*dictionary,
	ion_key_t			key,
	ion_value_t			value
) {
	ion_bpptree_t		*bpptree;
	ion_bpp_err_t		bErr;
	ion_file_offset_t	offset;
	ion_result_count_t	count;

	count	= 0;
	bpptree = (ion_bpptree_t *) dictionary->instance;

	bErr	= b_get(bpptree->tree, key, &offset);

	if (bErrKeyNotFound != bErr) {
		lfb_update_all(&(bpptree->values), offset, bpptree->super.record.value_size, (ion_byte_t *) value, &count);
	}
	else {
		return bpptree_insert(dictionary, key, value);
	}

	return ION_STATUS_OK(count);
}